

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cpp
# Opt level: O2

int __thiscall diy::mpi::status::count(status *this,datatype *type)

{
  int c;
  int local_c;
  
  MPI_Get_count(this,(type->handle).data,&local_c);
  return local_c;
}

Assistant:

int diy::mpi::status::count(const diy::mpi::datatype& type) const
{
#if DIY_HAS_MPI
  int c;
  MPI_Get_count(&mpi_cast(handle), mpi_cast(type.handle), &c);
  return c;
#else
  (void) type;
  DIY_UNSUPPORTED_MPI_CALL(diy::mpi::status::count);
#endif
}